

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# font_to_svg.hpp
# Opt level: O2

string * __thiscall font2svg::glyph::labelpts_abi_cxx11_(string *__return_storage_ptr__,glyph *this)

{
  undefined1 *puVar1;
  string *psVar2;
  ostream *poVar3;
  int i;
  long lVar4;
  allocator<char> local_61;
  undefined1 *local_60;
  string *local_58;
  string local_50 [32];
  
  local_58 = __return_storage_ptr__;
  std::__cxx11::string::string<std::allocator<char>>(local_50,"",&local_61);
  local_60 = &this->field_0x278;
  std::__cxx11::stringbuf::str((string *)local_60);
  std::__cxx11::string::~string(local_50);
  puVar1 = &this->field_0x270;
  for (lVar4 = 0; psVar2 = local_58, lVar4 < (this->ftoutline).n_points; lVar4 = lVar4 + 1) {
    std::operator<<((ostream *)puVar1,
                    "\n <g font-family=\'SVGFreeSansASCII,sans-serif\' font-size=\'10\'>\n");
    std::operator<<((ostream *)puVar1,"  <text id=\'revision\'");
    poVar3 = std::operator<<((ostream *)puVar1," x=\'");
    poVar3 = std::ostream::_M_insert<long>((long)poVar3);
    std::operator<<(poVar3,"\'");
    poVar3 = std::operator<<((ostream *)puVar1," y=\'");
    poVar3 = std::ostream::_M_insert<long>((long)poVar3);
    std::operator<<(poVar3,"\'");
    std::operator<<((ostream *)puVar1," stroke=\'none\' fill=\'darkgreen\'>\n");
    poVar3 = std::operator<<((ostream *)puVar1,"  ");
    poVar3 = std::ostream::_M_insert<long>((long)poVar3);
    poVar3 = std::operator<<(poVar3,",");
    std::ostream::_M_insert<long>((long)poVar3);
    std::operator<<((ostream *)puVar1,"  </text>\n");
    std::operator<<((ostream *)puVar1," </g>\n");
  }
  std::__cxx11::stringbuf::str();
  return psVar2;
}

Assistant:

std::string labelpts() {
		tmp.str("");
		for ( int i = 0 ; i < ftoutline.n_points ; i++ ) {
			tmp << "\n <g font-family='SVGFreeSansASCII,sans-serif' font-size='10'>\n";
			tmp << "  <text id='revision'";
			tmp << " x='" << ftpoints[i].x + 5 << "'";
			tmp << " y='" << ftpoints[i].y - 5 << "'";
			tmp << " stroke='none' fill='darkgreen'>\n";
			tmp << "  " << ftpoints[i].x  << "," << ftpoints[i].y;
			tmp << "  </text>\n";
			tmp << " </g>\n";
		}
		return tmp.str();
	}